

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void SortByDimension(Rtree *pRtree,int *aIdx,int nIdx,int iDim,RtreeCell *aCell,int *aSpare)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int nIdx_00;
  int nIdx_01;
  int *aIdx_00;
  RtreeDValue xright2;
  RtreeDValue xright1;
  RtreeDValue xleft2;
  RtreeDValue xleft1;
  int *aRight;
  int *aLeft;
  int nRight;
  int nLeft;
  int iRight;
  int iLeft;
  int *aSpare_local;
  RtreeCell *aCell_local;
  int iDim_local;
  int nIdx_local;
  int *aIdx_local;
  Rtree *pRtree_local;
  
  if (1 < nIdx) {
    nLeft = 0;
    nRight = 0;
    nIdx_00 = nIdx / 2;
    nIdx_01 = nIdx - nIdx_00;
    aIdx_00 = aIdx + nIdx_00;
    SortByDimension(pRtree,aIdx,nIdx_00,iDim,aCell,aSpare);
    SortByDimension(pRtree,aIdx_00,nIdx_01,iDim,aCell,aSpare);
    memcpy(aSpare,aIdx,(long)nIdx_00 << 2);
    while (nLeft < nIdx_00 || nRight < nIdx_01) {
      if (pRtree->eCoordType == '\0') {
        fVar1 = aCell[aSpare[nLeft]].aCoord[iDim << 1].f;
      }
      else {
        fVar1 = (float)aCell[aSpare[nLeft]].aCoord[iDim << 1].i;
      }
      if (pRtree->eCoordType == '\0') {
        fVar2 = aCell[aSpare[nLeft]].aCoord[iDim * 2 + 1].f;
      }
      else {
        fVar2 = (float)aCell[aSpare[nLeft]].aCoord[iDim * 2 + 1].i;
      }
      if (pRtree->eCoordType == '\0') {
        fVar3 = aCell[aIdx_00[nRight]].aCoord[iDim << 1].f;
      }
      else {
        fVar3 = (float)aCell[aIdx_00[nRight]].aCoord[iDim << 1].i;
      }
      if (pRtree->eCoordType == '\0') {
        fVar4 = aCell[aIdx_00[nRight]].aCoord[iDim * 2 + 1].f;
      }
      else {
        fVar4 = (float)aCell[aIdx_00[nRight]].aCoord[iDim * 2 + 1].i;
      }
      if ((nLeft == nIdx_00) ||
         (((nRight != nIdx_01 && (fVar3 <= fVar1)) &&
          ((fVar1 != fVar3 || ((NAN(fVar1) || NAN(fVar3) || (fVar4 <= fVar2)))))))) {
        aIdx[nLeft + nRight] = aIdx_00[nRight];
        nRight = nRight + 1;
      }
      else {
        aIdx[nLeft + nRight] = aSpare[nLeft];
        nLeft = nLeft + 1;
      }
    }
  }
  return;
}

Assistant:

static void SortByDimension(
  Rtree *pRtree,
  int *aIdx, 
  int nIdx, 
  int iDim, 
  RtreeCell *aCell, 
  int *aSpare
){
  if( nIdx>1 ){

    int iLeft = 0;
    int iRight = 0;

    int nLeft = nIdx/2;
    int nRight = nIdx-nLeft;
    int *aLeft = aIdx;
    int *aRight = &aIdx[nLeft];

    SortByDimension(pRtree, aLeft, nLeft, iDim, aCell, aSpare);
    SortByDimension(pRtree, aRight, nRight, iDim, aCell, aSpare);

    memcpy(aSpare, aLeft, sizeof(int)*nLeft);
    aLeft = aSpare;
    while( iLeft<nLeft || iRight<nRight ){
      RtreeDValue xleft1 = DCOORD(aCell[aLeft[iLeft]].aCoord[iDim*2]);
      RtreeDValue xleft2 = DCOORD(aCell[aLeft[iLeft]].aCoord[iDim*2+1]);
      RtreeDValue xright1 = DCOORD(aCell[aRight[iRight]].aCoord[iDim*2]);
      RtreeDValue xright2 = DCOORD(aCell[aRight[iRight]].aCoord[iDim*2+1]);
      if( (iLeft!=nLeft) && ((iRight==nRight)
       || (xleft1<xright1)
       || (xleft1==xright1 && xleft2<xright2)
      )){
        aIdx[iLeft+iRight] = aLeft[iLeft];
        iLeft++;
      }else{
        aIdx[iLeft+iRight] = aRight[iRight];
        iRight++;
      }
    }

#if 0
    /* Check that the sort worked */
    {
      int jj;
      for(jj=1; jj<nIdx; jj++){
        RtreeDValue xleft1 = aCell[aIdx[jj-1]].aCoord[iDim*2];
        RtreeDValue xleft2 = aCell[aIdx[jj-1]].aCoord[iDim*2+1];
        RtreeDValue xright1 = aCell[aIdx[jj]].aCoord[iDim*2];
        RtreeDValue xright2 = aCell[aIdx[jj]].aCoord[iDim*2+1];
        assert( xleft1<=xright1 && (xleft1<xright1 || xleft2<=xright2) );
      }
    }
#endif
  }
}